

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Parser::clear(Parser *this)

{
  (this->m_tokenizer).m_curToken = TOKEN_INCOMPLETE;
  (this->m_tokenizer).m_curTokenLen = 0;
  (this->m_tokenizer).m_state = STATE_DATA;
  (this->m_tokenizer).m_buf.m_numElements = 0;
  (this->m_tokenizer).m_buf.m_front = 0;
  (this->m_tokenizer).m_buf.m_back = 0;
  (this->m_elementName)._M_string_length = 0;
  *(this->m_elementName)._M_dataplus._M_p = '\0';
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_attributes)._M_t);
  (this->m_attribName)._M_string_length = 0;
  *(this->m_attribName)._M_dataplus._M_p = '\0';
  (this->m_entityValue)._M_string_length = 0;
  *(this->m_entityValue)._M_dataplus._M_p = '\0';
  this->m_element = ELEMENT_INCOMPLETE;
  this->m_state = STATE_DATA;
  return;
}

Assistant:

void Parser::clear (void)
{
	m_tokenizer.clear();
	m_elementName.clear();
	m_attributes.clear();
	m_attribName.clear();
	m_entityValue.clear();

	m_element	= ELEMENT_INCOMPLETE;
	m_state		= STATE_DATA;
}